

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O0

void anon_unknown.dwarf_7fa20::testHalfToUint(uint halfVal,uint uintVal)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  void *this;
  int in_ESI;
  uint16_t in_DI;
  half h;
  half local_a;
  int local_8;
  
  local_8 = in_ESI;
  Imath_3_2::half::setBits(&local_a,in_DI);
  poVar3 = std::operator<<((ostream *)&std::cout,"halfToUint (");
  poVar3 = (ostream *)::operator<<(poVar3,local_a);
  poVar3 = std::operator<<(poVar3,") == ");
  uVar1 = Imf_3_4::halfToUint(local_a);
  this = (void *)std::ostream::operator<<(poVar3,uVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  iVar2 = Imf_3_4::halfToUint(local_a);
  if (iVar2 == local_8) {
    return;
  }
  __assert_fail("halfToUint (h) == uintVal",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                ,0x38,"void (anonymous namespace)::testHalfToUint(unsigned int, unsigned int)");
}

Assistant:

void
testHalfToUint (unsigned int halfVal, unsigned int uintVal)
{
    half h;
    h.setBits (halfVal);
    cout << "halfToUint (" << h << ") == " << halfToUint (h) << endl;
    assert (halfToUint (h) == uintVal);
}